

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O2

void __thiscall
Ratio::setAllFEdges(Ratio *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges)

{
  double dVar1;
  
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator=(&this->fEdges,edges);
  dVar1 = geoAvg(&this->fEdges);
  this->fLength = dVar1;
  return;
}

Assistant:

void Ratio::setAllFEdges(vector<PhyloTreeEdge>& edges) {
    fEdges = edges;
    fLength = geoAvg(fEdges);
}